

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O1

uint32_t __thiscall spvtools::opt::InstrumentPass::GetVec4FloatId(InstrumentPass *this)

{
  IRContext *this_00;
  TypeManager *this_01;
  uint32_t uVar1;
  Type *pTVar2;
  Float float_ty;
  Vector v4float_ty;
  Type local_90;
  Vector local_68;
  
  if (this->v4float_id_ == 0) {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(this_00);
    }
    this_01 = (this_00->type_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
    local_90.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.kind_ = kFloat;
    local_90._36_4_ = 0x20;
    local_90._vptr_Type = (_func_int **)&PTR__Type_003ed9a0;
    pTVar2 = analysis::TypeManager::GetRegisteredType(this_01,&local_90);
    analysis::Vector::Vector(&local_68,pTVar2,4);
    pTVar2 = analysis::TypeManager::GetRegisteredType(this_01,&local_68.super_Type);
    uVar1 = analysis::TypeManager::GetTypeInstruction(this_01,pTVar2);
    this->v4float_id_ = uVar1;
    local_68.super_Type._vptr_Type = (_func_int **)&PTR__Type_003e9e18;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_68.super_Type.decorations_);
    local_90._vptr_Type = (_func_int **)&PTR__Type_003e9e18;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_90.decorations_);
  }
  return this->v4float_id_;
}

Assistant:

uint32_t InstrumentPass::GetVec4FloatId() {
  if (v4float_id_ == 0) {
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Float float_ty(32);
    analysis::Type* reg_float_ty = type_mgr->GetRegisteredType(&float_ty);
    analysis::Vector v4float_ty(reg_float_ty, 4);
    analysis::Type* reg_v4float_ty = type_mgr->GetRegisteredType(&v4float_ty);
    v4float_id_ = type_mgr->GetTypeInstruction(reg_v4float_ty);
  }
  return v4float_id_;
}